

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindowSettings * ImGui::FindWindowSettingsByWindow(ImGuiWindow *window)

{
  int iVar1;
  char *pcVar2;
  ImGuiWindowSettings *pIVar3;
  ImGuiWindowSettings *pIVar4;
  
  if ((long)window->SettingsOffset != -1) {
    return (ImGuiWindowSettings *)((GImGui->SettingsWindows).Buf.Data + window->SettingsOffset);
  }
  pcVar2 = (GImGui->SettingsWindows).Buf.Data;
  if (pcVar2 != (char *)0x0) {
    pIVar4 = (ImGuiWindowSettings *)(pcVar2 + 4);
    pIVar3 = pIVar4;
    do {
      if ((pIVar3->ID == window->ID) && (pIVar3->WantDelete != true)) {
        return pIVar3;
      }
      iVar1._0_1_ = pIVar3[-1].Collapsed;
      iVar1._1_1_ = pIVar3[-1].IsChild;
      iVar1._2_1_ = pIVar3[-1].WantApply;
      iVar1._3_1_ = pIVar3[-1].WantDelete;
      pIVar3 = (ImGuiWindowSettings *)((long)&pIVar3->ID + (long)iVar1);
    } while (pIVar3 != (ImGuiWindowSettings *)
                       ((long)&pIVar4->ID + (long)(GImGui->SettingsWindows).Buf.Size));
  }
  return (ImGuiWindowSettings *)0x0;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettingsByWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (window->SettingsOffset != -1)
        return g.SettingsWindows.ptr_from_offset(window->SettingsOffset);
    return FindWindowSettingsByID(window->ID);
}